

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence.h
# Opt level: O1

gcstring * GenApi_3_4::TrimSpace(gcstring *s,istream *is)

{
  ushort uVar1;
  ulong uVar2;
  char *pcVar3;
  ctype *pcVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  locale local_40 [8];
  locale local_38 [8];
  
  uVar2 = (**(code **)(*(long *)s + 0x80))();
  uVar9 = 0;
  while( true ) {
    if (uVar9 < uVar2) {
      pcVar3 = GenICam_3_4::gcstring::operator_cast_to_char_(s);
      bVar6 = pcVar3[uVar9];
      std::locale::locale(local_38,(locale *)(is + *(long *)(*(long *)is + -0x18) + 0xd0));
      pcVar4 = std::use_facet<std::ctype<char>>(local_38);
      bVar6 = (*(byte *)(*(long *)(pcVar4 + 0x30) + 1 + (ulong)bVar6 * 2) & 0x20) >> 5;
      std::locale::~locale(local_38);
    }
    else {
      bVar6 = 0;
    }
    if (bVar6 == 0) break;
    uVar9 = uVar9 + 1;
  }
  uVar5 = uVar2 - 1;
  if (uVar9 < uVar2 - 1) {
    uVar5 = uVar9;
  }
  do {
    uVar7 = uVar2;
    uVar2 = uVar7 - 1;
    uVar8 = uVar5;
    uVar10 = uVar5 + 1;
    if (uVar2 <= uVar9) break;
    pcVar3 = GenICam_3_4::gcstring::operator_cast_to_char_(s);
    bVar6 = pcVar3[uVar7 - 1];
    std::locale::locale(local_40,(locale *)(is + *(long *)(*(long *)is + -0x18) + 0xd0));
    pcVar4 = std::use_facet<std::ctype<char>>(local_40);
    uVar1 = *(ushort *)(*(long *)(pcVar4 + 0x30) + (ulong)bVar6 * 2);
    std::locale::~locale(local_40);
    uVar8 = uVar2;
    uVar10 = uVar7;
  } while ((uVar1 >> 0xd & 1) != 0);
  uVar2 = (**(code **)(*(long *)s + 0x80))(s);
  if (uVar8 < uVar2) {
    (**(code **)(*(long *)s + 0xa0))(s,uVar10,0xffffffffffffffff);
  }
  (**(code **)(*(long *)s + 0xa0))(s,0,uVar9);
  return s;
}

Assistant:

inline GENICAM_NAMESPACE::gcstring& TrimSpace( GENICAM_NAMESPACE::gcstring& s, std::istream& is )
    {
        size_t iend =s.length();
        size_t ibegin = 0;
        for (; ibegin < iend && std::isspace( s[ibegin], is.getloc() ); ++ibegin);
        for (--iend; ibegin < iend; --iend)
        {
            if (!std::isspace( s[iend], is.getloc() ))
                break;
        }
        if (iend < s.length())
        {
            s.erase(iend + 1);
        }
        s.erase( 0, ibegin );

        return s;
    }